

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Vector<kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>>>
          (Promise<void> *this,
          Vector<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_> *attachments)

{
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *pAVar1;
  RemoveConst<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_> *pRVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *pAVar3;
  PromiseNode *pPVar4;
  long *in_RDX;
  Vector<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_> local_48;
  PromiseNode *local_28;
  
  local_48.builder.ptr = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)*in_RDX;
  local_48.builder.pos =
       (RemoveConst<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_> *)in_RDX[1];
  local_48.builder.endPtr = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)in_RDX[2];
  local_48.builder.disposer = (ArrayDisposer *)in_RDX[3];
  in_RDX[2] = 0;
  *in_RDX = 0;
  in_RDX[1] = 0;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::Vector<kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>>>,kj::_::PromiseDisposer,kj::Vector<kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>>>
            ((PromiseDisposer *)&local_28,(OwnPromiseNode *)attachments,&local_48);
  pPVar4 = local_28;
  pAVar3 = local_48.builder.endPtr;
  pRVar2 = local_48.builder.pos;
  pAVar1 = local_48.builder.ptr;
  local_28 = (PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = pPVar4;
  if (local_48.builder.ptr != (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)0x0) {
    local_48.builder.ptr = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)0x0;
    local_48.builder.pos = (RemoveConst<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_> *)0x0
    ;
    local_48.builder.endPtr = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)0x0;
    (**(local_48.builder.disposer)->_vptr_ArrayDisposer)
              (local_48.builder.disposer,pAVar1,0x10,(long)pRVar2 - (long)pAVar1 >> 4,
               (long)pAVar3 - (long)pAVar1 >> 4,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}